

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Atom getAtomIfSupported(Atom *supportedAtoms,unsigned_long atomCount,char *atomName)

{
  Atom AVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  unsigned_long i;
  Atom atom;
  ulong local_30;
  
  AVar1 = XInternAtom(_glfw.x11.display,in_RDX,0);
  local_30 = 0;
  while( true ) {
    if (in_RSI <= local_30) {
      return 0;
    }
    if (*(Atom *)(in_RDI + local_30 * 8) == AVar1) break;
    local_30 = local_30 + 1;
  }
  return AVar1;
}

Assistant:

static Atom getAtomIfSupported(Atom* supportedAtoms,
                               unsigned long atomCount,
                               const char* atomName)
{
    const Atom atom = XInternAtom(_glfw.x11.display, atomName, False);

    for (unsigned long i = 0;  i < atomCount;  i++)
    {
        if (supportedAtoms[i] == atom)
            return atom;
    }

    return None;
}